

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_array_fill(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  long idx;
  JSValue obj;
  JSValue JVar2;
  JSValue val;
  long local_48;
  int64_t local_40;
  int64_t len;
  
  obj = JS_ToObject(ctx,this_val);
  iVar1 = js_get_length64(ctx,&len,obj);
  if ((iVar1 == 0) &&
     ((local_40 = 0, idx = local_40, argc < 2 ||
      ((((int)argv[1].tag == 3 ||
        (JVar2.tag = argv[1].tag, JVar2.u.ptr = argv[1].u.ptr,
        iVar1 = JS_ToInt64Clamp(ctx,&local_40,JVar2,0,len,len), iVar1 == 0)) &&
       ((local_48 = len, idx = local_40, argc == 2 ||
        (((int)argv[2].tag == 3 ||
         (val.tag = argv[2].tag, val.u.ptr = argv[2].u.ptr,
         iVar1 = JS_ToInt64Clamp(ctx,&local_48,val,0,len,len), idx = local_40, len = local_48,
         iVar1 == 0)))))))))) {
    do {
      if (len <= idx) {
        return obj;
      }
      JVar2 = *argv;
      if (0xfffffff4 < (uint)argv->tag) {
        *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
      }
      iVar1 = JS_SetPropertyInt64(ctx,obj,idx,JVar2);
      idx = idx + 1;
    } while (-1 < iVar1);
  }
  JS_FreeValue(ctx,obj);
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_array_fill(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    JSValue obj;
    int64_t len, start, end;

    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    start = 0;
    if (argc > 1 && !JS_IsUndefined(argv[1])) {
        if (JS_ToInt64Clamp(ctx, &start, argv[1], 0, len, len))
            goto exception;
    }

    end = len;
    if (argc > 2 && !JS_IsUndefined(argv[2])) {
        if (JS_ToInt64Clamp(ctx, &end, argv[2], 0, len, len))
            goto exception;
    }

    /* XXX: should special case fast arrays */
    while (start < end) {
        if (JS_SetPropertyInt64(ctx, obj, start,
                                JS_DupValue(ctx, argv[0])) < 0)
            goto exception;
        start++;
    }
    return obj;

 exception:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}